

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O1

void __thiscall
gui::DialogBox::handleMousePress(DialogBox *this,Button button,Vector2f *mouseParent)

{
  Widget *this_00;
  float fVar1;
  float fVar2;
  element_type *peVar3;
  Vector2f VVar4;
  Transform *this_01;
  Vector2f *pVVar5;
  float fVar6;
  float fStack_34;
  
  Group::handleMousePress(&this->super_Group,button,mouseParent);
  this_00 = &(this->super_Group).super_Container.super_Widget;
  this_01 = Widget::getInverseTransform(this_00);
  VVar4 = sf::Transform::transformPoint(this_01,mouseParent);
  pVVar5 = Widget::getOrigin(this_00);
  if ((button == Left) && (this->draggable_ == true)) {
    fStack_34 = VVar4.y;
    fVar1 = pVVar5->y;
    peVar3 = (this->style_).super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    fVar2 = peVar3->titleBarHeight_;
    fVar6 = sf::Shape::getOutlineThickness(&(peVar3->rect_).super_Shape);
    if (fStack_34 - fVar1 <= fVar2 - fVar6) {
      fVar1 = mouseParent->y;
      (this->dragPoint_).first.x = mouseParent->x;
      (this->dragPoint_).first.y = fVar1;
      (this->dragPoint_).second = true;
      pVVar5 = Widget::getPosition(this_00);
      this->initialPosition_ = *pVVar5;
    }
  }
  return;
}

Assistant:

void DialogBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left && draggable_ && mouseLocal.y <= style_->titleBarHeight_ - style_->rect_.getOutlineThickness()) {
        dragPoint_ = {mouseParent, true};
        initialPosition_ = getPosition();
    }
}